

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferFFS.cpp
# Opt level: O0

void __thiscall
adios2::format::BufferFFS::BufferFFS(BufferFFS *this,FFSBuffer Buf,void *data,size_t len)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  allocator *fixedSize;
  string *in_stack_ffffffffffffffa8;
  Buffer *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [40];
  undefined8 local_18;
  undefined8 local_10;
  
  fixedSize = &local_41;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"BufferFFS",fixedSize);
  Buffer::Buffer(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_t)fixedSize);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *in_RDI = &PTR__BufferFFS_01133ab8;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[8] = local_10;
  in_RDI[9] = local_18;
  return;
}

Assistant:

BufferFFS::BufferFFS(FFSBuffer Buf, void *data, size_t len) : Buffer("BufferFFS", len)
{
    m_buffer = Buf;
    m_data = data;
}